

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

void __thiscall HEkkPrimal::chooseRow(HEkkPrimal *this)

{
  int iVar1;
  HEkk *pHVar2;
  pointer piVar3;
  pointer pdVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  pHVar2 = this->ekk_instance_;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x27,0);
  this->row_out = -1;
  iVar1 = (pHVar2->info_).update_count;
  if (iVar1 < 10) {
    dVar9 = 1e-09;
  }
  else {
    dVar9 = *(double *)(&DAT_003dd050 + (ulong)(iVar1 < 0x14) * 8);
  }
  lVar5 = (long)(this->col_aq).count;
  if (lVar5 < 1) {
    dVar10 = 1e+100;
  }
  else {
    dVar10 = 1e+100;
    lVar6 = 0;
    do {
      iVar1 = (this->col_aq).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6];
      dVar7 = (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar1] * (double)this->move_in;
      if (dVar7 <= dVar9) {
        if ((dVar7 < -dVar9) &&
           (dVar8 = ((pHVar2->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar1] -
                    (pHVar2->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar1]) -
                    this->primal_feasibility_tolerance, dVar10 * dVar7 < dVar8)) goto LAB_00360ff5;
      }
      else {
        dVar8 = ((pHVar2->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar1] -
                (pHVar2->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar1]) +
                this->primal_feasibility_tolerance;
        if (dVar8 < dVar10 * dVar7) {
LAB_00360ff5:
          dVar10 = dVar8 / dVar7;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x27,0);
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x28,0);
  lVar5 = (long)(this->col_aq).count;
  if (0 < lVar5) {
    piVar3 = (this->col_aq).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar7 = 0.0;
    lVar6 = 0;
    do {
      iVar1 = piVar3[lVar6];
      dVar8 = pdVar4[iVar1] * (double)this->move_in;
      if (dVar8 <= dVar9) {
        if ((dVar8 < -dVar9) &&
           (dVar10 * dVar8 <
            (pHVar2->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar1] -
            (pHVar2->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar1])) {
          dVar8 = -dVar8;
          goto LAB_00361100;
        }
      }
      else if ((pHVar2->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar1] -
               (pHVar2->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar1] < dVar10 * dVar8) {
LAB_00361100:
        if (dVar7 < dVar8) {
          this->row_out = iVar1;
          dVar7 = dVar8;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x28,0);
  return;
}

Assistant:

void HEkkPrimal::chooseRow() {
  HighsSimplexInfo& info = ekk_instance_.info_;
  const vector<double>& baseLower = info.baseLower_;
  const vector<double>& baseUpper = info.baseUpper_;
  const vector<double>& baseValue = info.baseValue_;
  analysis->simplexTimerStart(Chuzr1Clock);
  // Initialize
  row_out = kNoRowChosen;

  // Choose row pass 1
  double alphaTol = info.update_count < 10   ? 1e-9
                    : info.update_count < 20 ? 1e-8
                                             : 1e-7;

  double relaxTheta = 1e100;
  double relaxSpace;
  for (HighsInt i = 0; i < col_aq.count; i++) {
    HighsInt iRow = col_aq.index[i];
    double alpha = col_aq.array[iRow] * move_in;
    if (alpha > alphaTol) {
      relaxSpace =
          baseValue[iRow] - baseLower[iRow] + primal_feasibility_tolerance;
      if (relaxSpace < relaxTheta * alpha) relaxTheta = relaxSpace / alpha;
    } else if (alpha < -alphaTol) {
      relaxSpace =
          baseValue[iRow] - baseUpper[iRow] - primal_feasibility_tolerance;
      if (relaxSpace > relaxTheta * alpha) relaxTheta = relaxSpace / alpha;
    }
  }
  analysis->simplexTimerStop(Chuzr1Clock);

  analysis->simplexTimerStart(Chuzr2Clock);
  double bestAlpha = 0;
  for (HighsInt i = 0; i < col_aq.count; i++) {
    HighsInt iRow = col_aq.index[i];
    double alpha = col_aq.array[iRow] * move_in;
    if (alpha > alphaTol) {
      // Positive pivotal column entry
      double tightSpace = baseValue[iRow] - baseLower[iRow];
      if (tightSpace < relaxTheta * alpha) {
        if (bestAlpha < alpha) {
          bestAlpha = alpha;
          row_out = iRow;
        }
      }
    } else if (alpha < -alphaTol) {
      // Negative pivotal column entry
      double tightSpace = baseValue[iRow] - baseUpper[iRow];
      if (tightSpace > relaxTheta * alpha) {
        if (bestAlpha < -alpha) {
          bestAlpha = -alpha;
          row_out = iRow;
        }
      }
    }
  }
  analysis->simplexTimerStop(Chuzr2Clock);
}